

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteDescriptor
          (WalletBatch *this,uint256 *desc_id,WalletDescriptor *descriptor)

{
  byte bVar1;
  WalletBatch *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>
  *in_stack_ffffffffffffff78;
  undefined1 fOverwrite;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>
  *in_stack_ffffffffffffff98;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fOverwrite = (undefined1)((ulong)local_48 >> 0x38);
  std::make_pair<std::__cxx11::string_const&,uint256_const&>
            (in_RDI,(uint256 *)in_stack_ffffffffffffff78);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,uint256>,wallet::WalletDescriptor>
                    (in_RDX,in_stack_ffffffffffffff98,
                     (WalletDescriptor *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(bool)fOverwrite)
  ;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>::
  ~pair(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteDescriptor(const uint256& desc_id, const WalletDescriptor& descriptor)
{
    return WriteIC(make_pair(DBKeys::WALLETDESCRIPTOR, desc_id), descriptor);
}